

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resCore.c
# Opt level: O2

int Abc_NtkResynthesize(Abc_Ntk_t *pNtk,Res_Par_t *pPars)

{
  undefined4 uVar1;
  undefined4 uVar2;
  Res_Win_t *pRVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int nVars;
  abctime aVar8;
  Res_Man_t *p;
  ProgressBar *p_00;
  Abc_Obj_t *pNode;
  abctime aVar9;
  abctime aVar10;
  Abc_Ntk_t *pAVar11;
  Vec_Ptr_t *pVVar12;
  Sto_Man_t *pSVar13;
  Kit_Graph_t *pGraph;
  long lVar14;
  Hop_Obj_t *pHVar15;
  uint *puTruth;
  
  aVar8 = Abc_Clock();
  p = Res_ManAlloc(pPars);
  iVar4 = Abc_NtkGetTotalFanins(pNtk);
  p->nTotalNets = iVar4;
  p->nTotalNodes = pNtk->nObjCounts[7];
  iVar5 = Abc_NtkGetFaninMax(pNtk);
  iVar4 = 8;
  if (iVar5 < 8) {
    iVar4 = iVar5;
  }
  iVar5 = 0;
  Abc_NtkSweep(pNtk,0);
  iVar6 = Abc_NtkToAig(pNtk);
  if (iVar6 == 0) {
    fwrite("Converting to BDD has failed.\n",0x1e,1,_stdout);
    Res_ManFree(p);
  }
  else {
    if (pNtk->ntkFunc != ABC_FUNC_AIG) {
      __assert_fail("Abc_NtkHasAig(pNtk)",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/res/resCore.c"
                    ,0xf3,"int Abc_NtkResynthesize(Abc_Ntk_t *, Res_Par_t *)");
    }
    Abc_NtkLevel(pNtk);
    Abc_NtkStartReverseLevels(pNtk,pPars->nGrowthLevel);
    iVar5 = pNtk->vObjs->nSize;
    p_00 = Extra_ProgressBarStart((FILE *)_stdout,iVar5);
    for (iVar6 = 0; iVar6 < pNtk->vObjs->nSize; iVar6 = iVar6 + 1) {
      pNode = (Abc_Obj_t *)Vec_PtrEntry(pNtk->vObjs,iVar6);
      if (pNode != (Abc_Obj_t *)0x0) {
        if ((p_00 == (ProgressBar *)0x0) || (p_00->nItemsNext <= iVar6)) {
          Extra_ProgressBarUpdate_int(p_00,iVar6,(char *)0x0);
        }
        if (((*(uint *)&pNode->field_0x14 & 0xf) == 7) && ((pNode->vFanins).nSize < 9)) {
          if (iVar5 < pNode->Id) break;
          aVar9 = Abc_Clock();
          iVar7 = p->pPars->nWindow;
          iVar7 = Res_WinCompute(pNode,iVar7 / 10,iVar7 % 10,p->pWin);
          aVar10 = Abc_Clock();
          p->timeWin = p->timeWin + (aVar10 - aVar9);
          if (iVar7 != 0) {
            iVar7 = Res_WinIsTrivial(p->pWin);
            p->nWinsTriv = p->nWinsTriv + iVar7;
            if (p->pPars->fVeryVerbose != 0) {
              printf("%5d (lev=%2d) : ",(ulong)(uint)pNode->Id,
                     (ulong)(*(uint *)&pNode->field_0x14 >> 0xc));
              pRVar3 = p->pWin;
              printf("Win = %3d/%3d/%4d/%3d   ",(ulong)(uint)pRVar3->vLeaves->nSize,
                     (ulong)(uint)pRVar3->vBranches->nSize,(ulong)(uint)pRVar3->vNodes->nSize,
                     (ulong)(uint)pRVar3->vRoots->nSize);
            }
            aVar9 = Abc_Clock();
            pRVar3 = p->pWin;
            iVar7 = Abc_ObjRequiredLevel(pNode);
            Res_WinDivisors(pRVar3,iVar7 + -1);
            aVar10 = Abc_Clock();
            p->timeDiv = p->timeDiv + (aVar10 - aVar9);
            uVar1 = p->nWins;
            uVar2 = p->nWinNodes;
            iVar7 = p->pWin->vNodes->nSize;
            p->nWins = uVar1 + 1;
            p->nWinNodes = iVar7 + uVar2;
            p->nDivNodes = p->nDivNodes + p->pWin->vDivs->nSize;
            if (p->pPars->fVeryVerbose != 0) {
              printf("D = %3d ");
              printf("D+ = %3d ",(ulong)(uint)p->pWin->nDivsPlus);
            }
            aVar9 = Abc_Clock();
            if (p->pAig != (Abc_Ntk_t *)0x0) {
              Abc_NtkDelete(p->pAig);
            }
            pAVar11 = Res_WndStrash(p->pWin);
            p->pAig = pAVar11;
            aVar10 = Abc_Clock();
            p->timeAig = p->timeAig + (aVar10 - aVar9);
            if (p->pPars->fVeryVerbose != 0) {
              printf("AIG = %4d ",(ulong)(uint)p->pAig->nObjCounts[7]);
              putchar(10);
            }
            aVar9 = Abc_Clock();
            iVar7 = Res_SimPrepare(p->pSim,p->pAig,p->pWin->vLeaves->nSize,0);
            aVar10 = Abc_Clock();
            p->timeSim = p->timeSim + (aVar10 - aVar9);
            if (iVar7 == 0) {
              p->nSimEmpty = p->nSimEmpty + 1;
            }
            else {
              iVar7 = p->pSim->fConst1;
              if (p->pSim->fConst0 == 0) {
                if (iVar7 != 0) {
                  p->nConstsUsed = p->nConstsUsed + 1;
                  goto LAB_003dff4f;
                }
                aVar9 = Abc_Clock();
                iVar7 = Res_FilterCandidates
                                  (p->pWin,p->pAig,p->pSim,p->vResubs,p->vResubsW,iVar4,
                                   (uint)(p->pPars->fArea != 0));
                aVar10 = Abc_Clock();
                p->timeCand = p->timeCand + (aVar10 - aVar9);
                p->nCandSets = p->nCandSets + iVar7;
                if (iVar7 != 0) {
                  p->nWinsUsed = p->nWinsUsed + 1;
                  iVar7 = 0;
                  do {
                    if ((p->vResubs->nSize <= iVar7) ||
                       (pVVar12 = Vec_VecEntry(p->vResubs,iVar7), pVVar12->nSize == 0)) break;
                    aVar9 = Abc_Clock();
                    if (p->pCnf != (Sto_Man_t *)0x0) {
                      Sto_ManFree(p->pCnf);
                    }
                    pSVar13 = (Sto_Man_t *)Res_SatProveUnsat(p->pAig,pVVar12);
                    p->pCnf = pSVar13;
                    aVar10 = Abc_Clock();
                    if (pSVar13 == (Sto_Man_t *)0x0) {
                      p->timeSatSat = p->timeSatSat + (aVar10 - aVar9);
                    }
                    else {
                      p->timeSatUnsat = p->timeSatUnsat + (aVar10 - aVar9);
                      p->nProvedSets = p->nProvedSets + 1;
                      aVar9 = Abc_Clock();
                      nVars = Int_ManInterpolate(p->pMan,p->pCnf,0,&puTruth);
                      aVar10 = Abc_Clock();
                      p->timeInt = p->timeInt + (aVar10 - aVar9);
                      if (nVars == pVVar12->nSize + -2) {
                        if (puTruth == (uint *)0x0) {
                          __assert_fail("puTruth",
                                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/res/resCore.c"
                                        ,0x17c,"int Abc_NtkResynthesize(Abc_Ntk_t *, Res_Par_t *)");
                        }
                        pGraph = Kit_TruthToGraph(puTruth,nVars,p->vMem);
                        pHVar15 = Kit_GraphToHop((Hop_Man_t *)pNtk->pManFunc,pGraph);
                        Kit_GraphFree(pGraph);
                        aVar9 = Abc_Clock();
                        pVVar12 = Vec_VecEntry(p->vResubsW,iVar7);
                        Res_UpdateNetwork(pNode,pVVar12,pHVar15,p->vLevels);
                        aVar10 = Abc_Clock();
                        p->timeUpd = p->timeUpd + (aVar10 - aVar9);
                        break;
                      }
                    }
                    iVar7 = iVar7 + 1;
                  } while( true );
                }
              }
              else {
                p->nConstsUsed = p->nConstsUsed + 1;
                if (iVar7 == 0) {
                  pHVar15 = (Hop_Obj_t *)(*(ulong *)((long)pNtk->pManFunc + 0x18) ^ 1);
                }
                else {
LAB_003dff4f:
                  pHVar15 = *(Hop_Obj_t **)((long)pNtk->pManFunc + 0x18);
                }
                pVVar12 = Vec_VecEntry(p->vResubsW,0);
                pVVar12->nSize = 0;
                Res_UpdateNetwork(pNode,pVVar12,pHVar15,p->vLevels);
              }
            }
          }
        }
      }
    }
    Extra_ProgressBarStop(p_00);
    Abc_NtkStopReverseLevels(pNtk);
    lVar14 = p->timeSatSim + p->pSim->timeSat;
    p->timeSatSim = lVar14;
    p->timeSatTotal = lVar14 + p->timeSatSat + p->timeSatUnsat;
    iVar4 = Abc_NtkGetTotalFanins(pNtk);
    p->nTotalNets2 = iVar4;
    p->nTotalNodes2 = pNtk->nObjCounts[7];
    aVar9 = Abc_Clock();
    p->timeTotal = aVar9 - aVar8;
    Res_ManFree(p);
    aVar9 = Abc_Clock();
    s_ResynTime = s_ResynTime + (aVar9 - aVar8);
    iVar4 = Abc_NtkCheck(pNtk);
    if (iVar4 == 0) {
      fwrite("Abc_NtkResynthesize(): Network check has failed.\n",0x31,1,_stdout);
      iVar5 = 0;
    }
    else {
      iVar5 = 1;
    }
  }
  return iVar5;
}

Assistant:

int Abc_NtkResynthesize( Abc_Ntk_t * pNtk, Res_Par_t * pPars )
{
    ProgressBar * pProgress;
    Res_Man_t * p;
    Abc_Obj_t * pObj;
    Hop_Obj_t * pFunc;
    Kit_Graph_t * pGraph;
    Vec_Ptr_t * vFanins;
    unsigned * puTruth;
    int i, k, RetValue, nNodesOld, nFanins, nFaninsMax;
    abctime clk, clkTotal = Abc_Clock();

    // start the manager
    p = Res_ManAlloc( pPars );
    p->nTotalNets = Abc_NtkGetTotalFanins(pNtk);
    p->nTotalNodes = Abc_NtkNodeNum(pNtk);
    nFaninsMax = Abc_NtkGetFaninMax(pNtk);
    if ( nFaninsMax > 8 )
        nFaninsMax = 8;

    // perform the network sweep
    Abc_NtkSweep( pNtk, 0 );

    // convert into the AIG
    if ( !Abc_NtkToAig(pNtk) )
    {
        fprintf( stdout, "Converting to BDD has failed.\n" );
        Res_ManFree( p );
        return 0;
    }
    assert( Abc_NtkHasAig(pNtk) );

    // set the number of levels
    Abc_NtkLevel( pNtk );
    Abc_NtkStartReverseLevels( pNtk, pPars->nGrowthLevel );

    // try resynthesizing nodes in the topological order
    nNodesOld = Abc_NtkObjNumMax(pNtk);
    pProgress = Extra_ProgressBarStart( stdout, nNodesOld );
    Abc_NtkForEachObj( pNtk, pObj, i )
    {
        Extra_ProgressBarUpdate( pProgress, i, NULL );
        if ( !Abc_ObjIsNode(pObj) )
            continue;
        if ( Abc_ObjFaninNum(pObj) > 8 )
            continue;
        if ( pObj->Id > nNodesOld )
            break;

        // create the window for this node
clk = Abc_Clock();
        RetValue = Res_WinCompute( pObj, p->pPars->nWindow/10, p->pPars->nWindow%10, p->pWin );
p->timeWin += Abc_Clock() - clk;
        if ( !RetValue )
            continue;
        p->nWinsTriv += Res_WinIsTrivial( p->pWin );

        if ( p->pPars->fVeryVerbose )
        {
            printf( "%5d (lev=%2d) : ", pObj->Id, pObj->Level );
            printf( "Win = %3d/%3d/%4d/%3d   ", 
                Vec_PtrSize(p->pWin->vLeaves), 
                Vec_PtrSize(p->pWin->vBranches),
                Vec_PtrSize(p->pWin->vNodes), 
                Vec_PtrSize(p->pWin->vRoots) );
        }

        // collect the divisors
clk = Abc_Clock();
        Res_WinDivisors( p->pWin, Abc_ObjRequiredLevel(pObj) - 1 );
p->timeDiv += Abc_Clock() - clk;

        p->nWins++;
        p->nWinNodes += Vec_PtrSize(p->pWin->vNodes);
        p->nDivNodes += Vec_PtrSize( p->pWin->vDivs);

        if ( p->pPars->fVeryVerbose )
        {
            printf( "D = %3d ", Vec_PtrSize(p->pWin->vDivs) );
            printf( "D+ = %3d ", p->pWin->nDivsPlus );
        }

        // create the AIG for the window
clk = Abc_Clock();
        if ( p->pAig ) Abc_NtkDelete( p->pAig );
        p->pAig = Res_WndStrash( p->pWin );
p->timeAig += Abc_Clock() - clk;

        if ( p->pPars->fVeryVerbose )
        {
            printf( "AIG = %4d ", Abc_NtkNodeNum(p->pAig) );
            printf( "\n" );
        }
 
        // prepare simulation info
clk = Abc_Clock();
        RetValue = Res_SimPrepare( p->pSim, p->pAig, Vec_PtrSize(p->pWin->vLeaves), 0 ); //p->pPars->fVerbose );
p->timeSim += Abc_Clock() - clk;
        if ( !RetValue )
        {
            p->nSimEmpty++;
            continue;
        }

        // consider the case of constant node
        if ( p->pSim->fConst0 || p->pSim->fConst1 )
        {
            p->nConstsUsed++;

            pFunc = p->pSim->fConst1? Hop_ManConst1((Hop_Man_t *)pNtk->pManFunc) : Hop_ManConst0((Hop_Man_t *)pNtk->pManFunc);
            vFanins = Vec_VecEntry( p->vResubsW, 0 );
            Vec_PtrClear( vFanins );
            Res_UpdateNetwork( pObj, vFanins, pFunc, p->vLevels );
            continue;
        }

//        printf( " " );

        // find resub candidates for the node
clk = Abc_Clock();
        if ( p->pPars->fArea )
            RetValue = Res_FilterCandidates( p->pWin, p->pAig, p->pSim, p->vResubs, p->vResubsW, nFaninsMax, 1 );
        else
            RetValue = Res_FilterCandidates( p->pWin, p->pAig, p->pSim, p->vResubs, p->vResubsW, nFaninsMax, 0 );
p->timeCand += Abc_Clock() - clk;
        p->nCandSets += RetValue;
        if ( RetValue == 0 )
            continue;

//        printf( "%d(%d) ", Vec_PtrSize(p->pWin->vDivs), RetValue );

        p->nWinsUsed++;

        // iterate through candidate resubstitutions
        Vec_VecForEachLevel( p->vResubs, vFanins, k )
        {
            if ( Vec_PtrSize(vFanins) == 0 )
                break;

            // solve the SAT problem and get clauses
clk = Abc_Clock();
            if ( p->pCnf ) Sto_ManFree( p->pCnf );
            p->pCnf = (Sto_Man_t *)Res_SatProveUnsat( p->pAig, vFanins );
            if ( p->pCnf == NULL )
            {
p->timeSatSat += Abc_Clock() - clk;
//                printf( " Sat\n" );
//                printf( "-" );
                continue;
            }
p->timeSatUnsat += Abc_Clock() - clk;
//            printf( "+" );

            p->nProvedSets++;
//            printf( " Unsat\n" );
//            continue;
//            printf( "Proved %d.\n", k );

            // write it into a file
//            Sto_ManDumpClauses( p->pCnf, "trace.cnf" );

            // interpolate the problem if it was UNSAT
clk = Abc_Clock();
            nFanins = Int_ManInterpolate( p->pMan, p->pCnf, 0, &puTruth );
p->timeInt += Abc_Clock() - clk;
            if ( nFanins != Vec_PtrSize(vFanins) - 2 )
                continue;
            assert( puTruth );
//            Extra_PrintBinary( stdout, puTruth, 1 << nFanins );  printf( "\n" );

            // transform interpolant into the AIG
            pGraph = Kit_TruthToGraph( puTruth, nFanins, p->vMem );

            // derive the AIG for the decomposition tree
            pFunc = Kit_GraphToHop( (Hop_Man_t *)pNtk->pManFunc, pGraph );
            Kit_GraphFree( pGraph );

            // update the network
clk = Abc_Clock();
            Res_UpdateNetwork( pObj, Vec_VecEntry(p->vResubsW, k), pFunc, p->vLevels );
p->timeUpd += Abc_Clock() - clk;
            break;
        }
//        printf( "\n" );
    }
    Extra_ProgressBarStop( pProgress );
    Abc_NtkStopReverseLevels( pNtk );

p->timeSatSim += p->pSim->timeSat;
p->timeSatTotal = p->timeSatSat + p->timeSatUnsat + p->timeSatSim;

    p->nTotalNets2 = Abc_NtkGetTotalFanins(pNtk);
    p->nTotalNodes2 = Abc_NtkNodeNum(pNtk);

    // quit resubstitution manager
p->timeTotal = Abc_Clock() - clkTotal;
    Res_ManFree( p );

s_ResynTime += Abc_Clock() - clkTotal;
    // check the resulting network
    if ( !Abc_NtkCheck( pNtk ) )
    {
        fprintf( stdout, "Abc_NtkResynthesize(): Network check has failed.\n" );
        return 0;
    }
    return 1;
}